

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O1

int chknode(chkctx *ctx,int level,node234_conflict *node,void *lowbound,void *highbound)

{
  long lVar1;
  node234_conflict *pnVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar6 = 0;
  do {
    if (node->kids[uVar6] == (node234 *)0x0) goto LAB_00102a35;
    uVar6 = uVar6 + 1;
  } while (uVar6 != 4);
  uVar6 = 4;
LAB_00102a35:
  uVar3 = (uint)uVar6;
  uVar6 = uVar6 & 0xffffffff;
  if (uVar3 < 4) {
    lVar10 = 0;
    do {
      if (node->kids[uVar6 + lVar10] == (node234 *)0x0) {
        if (node->counts[uVar6 + lVar10] != 0) {
          error("node %p: kids[%d] NULL but count[%d]=%d nonzero",node,(ulong)((int)lVar10 + uVar3))
          ;
        }
      }
      else {
        error("node %p: nkids=%d but kids[%d] non-NULL",node,uVar6,(ulong)((int)lVar10 + uVar3));
      }
      lVar1 = lVar10 + uVar6;
      lVar10 = lVar10 + 1;
    } while (lVar1 != 3);
  }
  uVar11 = 0;
  do {
    if (node->elems[uVar11] == (void *)0x0) goto LAB_00102abe;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 3);
  uVar11 = 3;
LAB_00102abe:
  uVar5 = (uint)uVar11;
  uVar7 = uVar11 & 0xffffffff;
  uVar12 = uVar7;
  if (uVar5 < 3) {
    do {
      if (node->elems[uVar12] != (void *)0x0) {
        error("node %p: nelems=%d but elems[%d] non-NULL",node,uVar11 & 0xffffffff,
              uVar12 & 0xffffffff);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != 3);
  }
  if (uVar6 == 0) {
    if (ctx->treedepth < 0) {
      ctx->treedepth = level;
    }
    else if (ctx->treedepth != level) {
      error("node %p: leaf at depth %d, previously seen depth %d",node,(ulong)(uint)level);
    }
  }
  else {
    uVar12 = (ulong)(uVar5 + 1);
    if (uVar5 == 0) {
      uVar12 = uVar11 & 0xffffffff;
    }
    if (uVar3 != (uint)uVar12) {
      error("node %p: %d elems should mean %d kids but has %d",node,uVar11 & 0xffffffff,uVar12,uVar6
           );
    }
  }
  if (uVar5 == 0) {
    error("node %p: no elems",node);
  }
  ctx->elemcount = ctx->elemcount + uVar5;
  if (-1 < (int)uVar5 && cmp != (cmpfn234)0x0) {
    uVar12 = 0;
    do {
      pvVar8 = lowbound;
      if (uVar12 != 0) {
        pvVar8 = node->elems[uVar12 - 1];
      }
      pvVar9 = highbound;
      if (uVar7 != uVar12) {
        pvVar9 = node->elems[uVar12];
      }
      if (((pvVar8 != (void *)0x0) && (pvVar9 != (void *)0x0)) &&
         (iVar4 = (*cmp)(pvVar8,pvVar9), -1 < iVar4)) {
        error("node %p: kid comparison [%d=%s,%d=%s] failed",node,(ulong)((int)uVar12 - 1),pvVar8,
              uVar12 & 0xffffffff,pvVar9);
      }
      uVar12 = uVar12 + 1;
    } while (uVar7 + 1 != uVar12);
  }
  if (uVar6 != 0) {
    uVar12 = 0;
    do {
      pnVar2 = node->kids[uVar12]->parent;
      if (pnVar2 != node) {
        error("node %p kid %d: parent ptr is %p not %p",node,uVar12 & 0xffffffff,pnVar2,node);
      }
      uVar12 = uVar12 + 1;
    } while (uVar6 != uVar12);
    uVar12 = 0;
    do {
      pvVar8 = lowbound;
      if (uVar12 != 0) {
        pvVar8 = node->elems[uVar12 - 1];
      }
      pvVar9 = highbound;
      if (uVar12 < uVar7) {
        pvVar9 = node->elems[uVar12];
      }
      uVar5 = chknode(ctx,level + 1,node->kids[uVar12],pvVar8,pvVar9);
      if (node->counts[uVar12] != uVar5) {
        error("node %p kid %d: count says %d, subtree really has %d",node,uVar12 & 0xffffffff,
              (ulong)(uint)node->counts[uVar12],(ulong)uVar5);
      }
      uVar5 = (int)uVar11 + uVar5;
      uVar11 = (ulong)uVar5;
      uVar12 = uVar12 + 1;
    } while (uVar6 != uVar12);
  }
  return uVar5;
}

Assistant:

int chknode(chkctx * ctx, int level, node234 * node,
            void *lowbound, void *highbound)
{
    int nkids, nelems;
    int i;
    int count;

    /* Count the non-NULL kids. */
    for (nkids = 0; nkids < 4 && node->kids[nkids]; nkids++);
    /* Ensure no kids beyond the first NULL are non-NULL. */
    for (i = nkids; i < 4; i++)
        if (node->kids[i]) {
            error("node %p: nkids=%d but kids[%d] non-NULL",
                  node, nkids, i);
        } else if (node->counts[i]) {
            error("node %p: kids[%d] NULL but count[%d]=%d nonzero",
                  node, i, i, node->counts[i]);
        }

    /* Count the non-NULL elements. */
    for (nelems = 0; nelems < 3 && node->elems[nelems]; nelems++);
    /* Ensure no elements beyond the first NULL are non-NULL. */
    for (i = nelems; i < 3; i++)
        if (node->elems[i]) {
            error("node %p: nelems=%d but elems[%d] non-NULL",
                  node, nelems, i);
        }

    if (nkids == 0) {
        /*
         * If nkids==0, this is a leaf node; verify that the tree
         * depth is the same everywhere.
         */
        if (ctx->treedepth < 0)
            ctx->treedepth = level;    /* we didn't know the depth yet */
        else if (ctx->treedepth != level)
            error("node %p: leaf at depth %d, previously seen depth %d",
                  node, level, ctx->treedepth);
    } else {
        /*
         * If nkids != 0, then it should be nelems+1, unless nelems
         * is 0 in which case nkids should also be 0 (and so we
         * shouldn't be in this condition at all).
         */
        int shouldkids = (nelems ? nelems + 1 : 0);
        if (nkids != shouldkids) {
            error("node %p: %d elems should mean %d kids but has %d",
                  node, nelems, shouldkids, nkids);
        }
    }

    /*
     * nelems should be at least 1.
     */
    if (nelems == 0) {
        error("node %p: no elems", node);
    }

    /*
     * Add nelems to the running element count of the whole tree.
     */
    ctx->elemcount += nelems;

    /*
     * Check ordering property: all elements should be strictly >
     * lowbound, strictly < highbound, and strictly < each other in
     * sequence. (lowbound and highbound are NULL at edges of tree
     * - both NULL at root node - and NULL is considered to be <
     * everything and > everything. IYSWIM.)
     */
    if (cmp) {
        for (i = -1; i < nelems; i++) {
            void *lower = (i == -1 ? lowbound : node->elems[i]);
            void *higher =
                (i + 1 == nelems ? highbound : node->elems[i + 1]);
            if (lower && higher && cmp(lower, higher) >= 0) {
                error("node %p: kid comparison [%d=%s,%d=%s] failed",
                      node, i, (char *)lower, i + 1, (char *)higher);
            }
        }
    }

    /*
     * Check parent pointers: all non-NULL kids should have a
     * parent pointer coming back to this node.
     */
    for (i = 0; i < nkids; i++)
        if (node->kids[i]->parent != node) {
            error("node %p kid %d: parent ptr is %p not %p",
                  node, i, node->kids[i]->parent, node);
        }


    /*
     * Now (finally!) recurse into subtrees.
     */
    count = nelems;

    for (i = 0; i < nkids; i++) {
        void *lower = (i == 0 ? lowbound : node->elems[i - 1]);
        void *higher = (i >= nelems ? highbound : node->elems[i]);
        int subcount =
            chknode(ctx, level + 1, node->kids[i], lower, higher);
        if (node->counts[i] != subcount) {
            error("node %p kid %d: count says %d, subtree really has %d",
                  node, i, node->counts[i], subcount);
        }
        count += subcount;
    }

    return count;
}